

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O2

void duckdb::ExportStateAggregateSerialize
               (Serializer *serializer,optional_ptr<duckdb::FunctionData,_true> bind_data_p,
               AggregateFunction *function)

{
  NotImplementedException *this;
  allocator local_39;
  string local_38;
  
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"FIXME: export state serialize",&local_39);
  NotImplementedException::NotImplementedException(this,&local_38);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void ExportStateAggregateSerialize(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
                                          const AggregateFunction &function) {
	throw NotImplementedException("FIXME: export state serialize");
}